

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_sampler_skip.cpp
# Opt level: O0

void KokkosTools::Sampler::kokkosp_end_parallel_scan(uint64_t kID)

{
  mapped_type mVar1;
  bool bVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  uint64_t retrievedNestedkID;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_18;
  uint64_t local_10;
  uint64_t kID_local;
  
  if (endScanCallee != (code *)0x0) {
    local_10 = kID;
    local_18._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::find((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 *)infokIDSample,&local_10);
    retrievedNestedkID =
         (uint64_t)
         std::
         unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::end((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                *)infokIDSample);
    bVar2 = std::__detail::operator==
                      (&local_18,
                       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)
                       &retrievedNestedkID);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pmVar3 = std::
               unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::operator[]((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                             *)infokIDSample,&local_10);
      mVar1 = *pmVar3;
      if (0 < tool_verbosity) {
        poVar4 = std::operator<<((ostream *)&std::cout,"KokkosP: sample ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
        std::operator<<(poVar4," calling child-end function...\n");
      }
      if (tool_globFence != 0) {
        invoke_ktools_fence(0);
      }
      (*endScanCallee)(mVar1);
      if (0 < tool_verbosity) {
        poVar4 = std::operator<<((ostream *)&std::cout,"KokkosP: sample ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
        std::operator<<(poVar4," finished with child-end function.\n");
      }
      std::
      unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
      ::erase((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               *)infokIDSample,&local_10);
    }
  }
  return;
}

Assistant:

void kokkosp_end_parallel_scan(const uint64_t kID) {
  if (NULL != endScanCallee) {
    if (!(infokIDSample.find(kID) == infokIDSample.end())) {
      uint64_t retrievedNestedkID = infokIDSample[kID];
      if (tool_verbosity > 0) {
        std::cout << "KokkosP: sample " << kID
                  << " calling child-end function...\n";
      }
      if (tool_globFence) {
        invoke_ktools_fence(0);
      }
      (*endScanCallee)(retrievedNestedkID);
      if (tool_verbosity > 0) {
        std::cout << "KokkosP: sample " << kID
                  << " finished with child-end function.\n";
      }
      infokIDSample.erase(kID);
    }
  }
}